

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageTest::iterate(StorageTest *this)

{
  RenderbufferInternalFormatConfiguration format;
  RenderbufferInternalFormatConfiguration format_00;
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  uint local_84;
  uint local_80;
  GLuint j;
  GLuint i;
  GLuint test_cases_count;
  anon_struct_8_2_6a0cb59c test_cases [5];
  GLuint local_34;
  byte local_2f;
  bool local_2e;
  undefined1 local_2d;
  GLint max_renderbuffer_size;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  StorageTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  max_renderbuffer_size = (GLint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)max_renderbuffer_size);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = true;
    local_2f = 0;
    local_34 = 0x4000;
    (**(code **)(lStack_20 + 0x868))(0x84e8,&local_34);
    err = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(err,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1f5d);
    i = 1;
    test_cases_count = 1;
    test_cases[0].width = 0x100;
    test_cases[0].height = 0x200;
    test_cases[1].width = 0x500;
    test_cases[1].height = 0x2d0;
    test_cases[2].width = local_34;
    test_cases[2].height = 1;
    test_cases[3].width = 1;
    test_cases[3].height = local_34;
    for (local_80 = 0; local_80 < 5; local_80 = local_80 + 1) {
      for (local_84 = 0; local_84 < 0x2b; local_84 = local_84 + 1) {
        format._16_8_ =
             *(undefined8 *)
              (s_renderbuffer_internalformat_configuration + (ulong)local_84 * 0x18 + 0x10);
        format._0_16_ =
             *(undefined1 (*) [16])
              (s_renderbuffer_internalformat_configuration + (ulong)local_84 * 0x18);
        bVar1 = PrepareRenderbuffer(this,format,(&i)[(ulong)local_80 * 2],
                                    test_cases[(ulong)local_80 - 1].height);
        if (bVar1) {
          Clear(this,(bool)(s_renderbuffer_internalformat_configuration
                            [(ulong)local_84 * 0x18 + 0x16] & 1));
          format_00._16_8_ =
               *(undefined8 *)
                (s_renderbuffer_internalformat_configuration + (ulong)local_84 * 0x18 + 0x10);
          format_00._0_16_ =
               *(undefined1 (*) [16])
                (s_renderbuffer_internalformat_configuration + (ulong)local_84 * 0x18);
          bVar1 = Check(this,format_00,(&i)[(ulong)local_80 * 2],
                        test_cases[(ulong)local_80 - 1].height);
          local_2e = (local_2e & 1U & bVar1) != 0;
        }
        else {
          local_2e = false;
        }
        Clean(this);
      }
    }
    if ((local_2e & 1U) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		glw::GLint max_renderbuffer_size = 16384 /* Specification minimum. */;

		gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE, &max_renderbuffer_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		const struct
		{
			glw::GLuint width;
			glw::GLuint height;
		} test_cases[] = { { 1, 1 },
						   { 256, 512 },
						   { 1280, 720 },
						   { (glw::GLuint)max_renderbuffer_size, 1 },
						   { 1, (glw::GLuint)max_renderbuffer_size } };

		const glw::GLuint test_cases_count = sizeof(test_cases) / sizeof(test_cases[0]);

		for (glw::GLuint i = 0; i < test_cases_count; ++i)
		{
			for (glw::GLuint j = 0; j < s_renderbuffer_internalformat_configuration_count; ++j)
			{
				if (PrepareRenderbuffer(s_renderbuffer_internalformat_configuration[j], test_cases[i].width,
										test_cases[i].height))
				{
					Clear(s_renderbuffer_internalformat_configuration[j].isColorIntegralFormat);
					is_ok &= Check(s_renderbuffer_internalformat_configuration[j], test_cases[i].width,
								   test_cases[i].height);
				}
				else
				{
					is_ok = false;
				}

				Clean();
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		Clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}